

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O1

void Min_CubeCreate(Vec_Str_t *vCover,Min_Cube_t *pCube,char Type)

{
  int *piVar1;
  int iVar2;
  char cVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  size_t sVar10;
  
  uVar5 = *(uint *)&pCube->field_0x8 >> 10 & 0xfff;
  if (uVar5 == 0) {
    uVar6 = 0;
  }
  else {
    uVar8 = 0;
    uVar6 = 0;
    do {
      uVar9 = 0xfffffffe;
      do {
        uVar9 = uVar9 + 2;
        uVar6 = uVar6 + (((pCube->uData[uVar8] >> 1 ^ pCube->uData[uVar8]) >> (uVar9 & 0x1f) & 1) !=
                        0);
      } while (uVar9 < 0x1e);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
  }
  if (*(uint *)&pCube->field_0x8 >> 0x16 != uVar6) {
    __assert_fail("(int)pCube->nLits == Min_CubeCountLits(pCube)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMinUtil.c"
                  ,0x30,"void Min_CubeCreate(Vec_Str_t *, Min_Cube_t *, char)");
  }
  if ((*(ushort *)&pCube->field_0x8 & 0x3ff) != 0) {
    piVar1 = &vCover->nSize;
    bVar7 = 0;
    uVar5 = 0;
    do {
      uVar9 = 2 << (bVar7 & 0x1e) & pCube->uData[uVar5 >> 4];
      uVar6 = vCover->nCap;
      uVar8 = (ulong)uVar6;
      if ((pCube->uData[uVar5 >> 4] >> (bVar7 & 0x1e) & 1) == 0) {
        if (uVar9 == 0) {
          cVar3 = '?';
          if (*piVar1 == uVar6) {
            if ((int)uVar6 < 0x10) {
              if (vCover->pArray == (char *)0x0) {
                pcVar4 = (char *)malloc(0x10);
              }
              else {
                pcVar4 = (char *)realloc(vCover->pArray,0x10);
              }
              vCover->pArray = pcVar4;
              cVar3 = '?';
              goto LAB_00452e48;
            }
            sVar10 = uVar8 * 2;
            if ((int)uVar6 < (int)sVar10) {
              if (vCover->pArray == (char *)0x0) {
                pcVar4 = (char *)malloc(sVar10);
              }
              else {
                pcVar4 = (char *)realloc(vCover->pArray,sVar10);
              }
              vCover->pArray = pcVar4;
              cVar3 = '?';
              goto LAB_00452e4e;
            }
          }
        }
        else {
          cVar3 = '1';
          if (*piVar1 == uVar6) {
            if ((int)uVar6 < 0x10) {
              if (vCover->pArray == (char *)0x0) {
                pcVar4 = (char *)malloc(0x10);
              }
              else {
                pcVar4 = (char *)realloc(vCover->pArray,0x10);
              }
              vCover->pArray = pcVar4;
              cVar3 = '1';
              goto LAB_00452e48;
            }
            sVar10 = uVar8 * 2;
            if ((int)uVar6 < (int)sVar10) {
              if (vCover->pArray == (char *)0x0) {
                pcVar4 = (char *)malloc(sVar10);
              }
              else {
                pcVar4 = (char *)realloc(vCover->pArray,sVar10);
              }
              vCover->pArray = pcVar4;
              cVar3 = '1';
              goto LAB_00452e4e;
            }
          }
        }
      }
      else if (uVar9 == 0) {
        cVar3 = '0';
        if (*piVar1 == uVar6) {
          if ((int)uVar6 < 0x10) {
            if (vCover->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(0x10);
            }
            else {
              pcVar4 = (char *)realloc(vCover->pArray,0x10);
            }
            vCover->pArray = pcVar4;
            cVar3 = '0';
            goto LAB_00452e48;
          }
          sVar10 = uVar8 * 2;
          if ((int)uVar6 < (int)sVar10) {
            if (vCover->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(sVar10);
            }
            else {
              pcVar4 = (char *)realloc(vCover->pArray,sVar10);
            }
            vCover->pArray = pcVar4;
            cVar3 = '0';
            goto LAB_00452e4e;
          }
        }
      }
      else {
        cVar3 = '-';
        if (*piVar1 == uVar6) {
          if ((int)uVar6 < 0x10) {
            if (vCover->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(0x10);
            }
            else {
              pcVar4 = (char *)realloc(vCover->pArray,0x10);
            }
            vCover->pArray = pcVar4;
            cVar3 = '-';
LAB_00452e48:
            sVar10 = 0x10;
          }
          else {
            sVar10 = uVar8 * 2;
            if ((int)sVar10 <= (int)uVar6) goto LAB_00452e5c;
            if (vCover->pArray == (char *)0x0) {
              pcVar4 = (char *)malloc(sVar10);
            }
            else {
              pcVar4 = (char *)realloc(vCover->pArray,sVar10);
            }
            vCover->pArray = pcVar4;
            cVar3 = '-';
          }
LAB_00452e4e:
          vCover->nCap = (int)sVar10;
        }
      }
LAB_00452e5c:
      iVar2 = *piVar1;
      *piVar1 = iVar2 + 1;
      vCover->pArray[iVar2] = cVar3;
      uVar5 = uVar5 + 1;
      bVar7 = bVar7 + 2;
    } while (uVar5 < (*(uint *)&pCube->field_0x8 & 0x3ff));
  }
  uVar5 = vCover->nCap;
  if (vCover->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vCover->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vCover->pArray,0x10);
      }
      vCover->pArray = pcVar4;
      sVar10 = 0x10;
    }
    else {
      sVar10 = (ulong)uVar5 * 2;
      if ((int)sVar10 <= (int)uVar5) goto LAB_00452f1c;
      if (vCover->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar10);
      }
      else {
        pcVar4 = (char *)realloc(vCover->pArray,sVar10);
      }
      vCover->pArray = pcVar4;
    }
    vCover->nCap = (int)sVar10;
  }
LAB_00452f1c:
  iVar2 = vCover->nSize;
  vCover->nSize = iVar2 + 1;
  vCover->pArray[iVar2] = ' ';
  uVar5 = vCover->nCap;
  if (vCover->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vCover->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vCover->pArray,0x10);
      }
      sVar10 = 0x10;
    }
    else {
      sVar10 = (ulong)uVar5 * 2;
      if ((int)sVar10 <= (int)uVar5) goto LAB_00452f8b;
      if (vCover->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar10);
      }
      else {
        pcVar4 = (char *)realloc(vCover->pArray,sVar10);
      }
    }
    vCover->pArray = pcVar4;
    vCover->nCap = (int)sVar10;
  }
LAB_00452f8b:
  iVar2 = vCover->nSize;
  vCover->nSize = iVar2 + 1;
  vCover->pArray[iVar2] = Type;
  uVar5 = vCover->nCap;
  if (vCover->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vCover->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vCover->pArray,0x10);
      }
      sVar10 = 0x10;
    }
    else {
      sVar10 = (ulong)uVar5 * 2;
      if ((int)sVar10 <= (int)uVar5) goto LAB_00452ff9;
      if (vCover->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar10);
      }
      else {
        pcVar4 = (char *)realloc(vCover->pArray,sVar10);
      }
    }
    vCover->pArray = pcVar4;
    vCover->nCap = (int)sVar10;
  }
LAB_00452ff9:
  iVar2 = vCover->nSize;
  vCover->nSize = iVar2 + 1;
  vCover->pArray[iVar2] = '\n';
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Min_CubeCreate( Vec_Str_t * vCover, Min_Cube_t * pCube, char Type )
{
    int i;
    assert( (int)pCube->nLits == Min_CubeCountLits(pCube) );
    for ( i = 0; i < (int)pCube->nVars; i++ )
        if ( Min_CubeHasBit(pCube, i*2) )
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
//                fprintf( pFile, "-" );
                Vec_StrPush( vCover, '-' );
            else
//                fprintf( pFile, "0" );
                Vec_StrPush( vCover, '0' );
        }
        else
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
 //               fprintf( pFile, "1" );
                Vec_StrPush( vCover, '1' );
            else
//                fprintf( pFile, "?" );
                Vec_StrPush( vCover, '?' );
        }
//    fprintf( pFile, " 1\n" );
    Vec_StrPush( vCover, ' ' );
    Vec_StrPush( vCover, Type );
    Vec_StrPush( vCover, '\n' );
}